

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O0

void Abc_AigDeleteNode(Abc_Aig_t *pMan,Abc_Obj_t *pNode)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj;
  int local_38;
  int local_34;
  int k;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode0;
  Abc_Obj_t *pNode_local;
  Abc_Aig_t *pMan_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x3d2,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x3d3,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFaninNum(pNode);
  if (iVar1 != 2) {
    __assert_fail("Abc_ObjFaninNum(pNode) == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x3d4,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjFanoutNum(pNode);
  if (iVar1 == 0) {
    for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->vStackReplaceOld), local_34 < iVar1;
        local_34 = local_34 + 1) {
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pMan->vStackReplaceOld,local_34);
      if (pNode == pAVar2) {
        for (local_38 = local_34; local_38 < pMan->vStackReplaceOld->nSize + -1;
            local_38 = local_38 + 1) {
          pMan->vStackReplaceOld->pArray[local_38] = pMan->vStackReplaceOld->pArray[local_38 + 1];
          pMan->vStackReplaceNew->pArray[local_38] = pMan->vStackReplaceNew->pArray[local_38 + 1];
        }
        pMan->vStackReplaceOld->nSize = pMan->vStackReplaceOld->nSize + -1;
        pMan->vStackReplaceNew->nSize = pMan->vStackReplaceNew->nSize + -1;
      }
    }
    local_34 = 0;
    while( true ) {
      iVar1 = Vec_PtrSize(pMan->vStackReplaceNew);
      if (iVar1 <= local_34) {
        pAVar2 = Abc_ObjFanin0(pNode);
        pObj = Abc_ObjFanin1(pNode);
        if (pMan->vUpdatedNets != (Vec_Ptr_t *)0x0) {
          Vec_PtrPushUnique(pMan->vUpdatedNets,pAVar2);
          Vec_PtrPushUnique(pMan->vUpdatedNets,pObj);
        }
        Abc_AigAndDelete(pMan,pNode);
        if ((*(uint *)&pNode->field_0x14 >> 4 & 1) != 0) {
          Abc_AigRemoveFromLevelStructure(pMan->vLevels,pNode);
        }
        if ((*(uint *)&pNode->field_0x14 >> 5 & 1) != 0) {
          Abc_AigRemoveFromLevelStructureR(pMan->vLevelsR,pNode);
        }
        Abc_NtkDeleteObj(pNode);
        iVar1 = Abc_ObjIsNode(pAVar2);
        if ((iVar1 != 0) && ((pAVar2->vFanouts).nSize == 0)) {
          Abc_AigDeleteNode(pMan,pAVar2);
        }
        iVar1 = Abc_ObjIsNode(pObj);
        if ((iVar1 != 0) && ((pObj->vFanouts).nSize == 0)) {
          Abc_AigDeleteNode(pMan,pObj);
        }
        return;
      }
      pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(pMan->vStackReplaceNew,local_34);
      pAVar2 = Abc_ObjRegular(pAVar2);
      if (pNode == pAVar2) break;
      local_34 = local_34 + 1;
    }
    return;
  }
  __assert_fail("Abc_ObjFanoutNum(pNode) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                ,0x3d5,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_AigDeleteNode( Abc_Aig_t * pMan, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1, * pTemp;
    int i, k;

    // make sure the node is regular and dangling
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_ObjFaninNum(pNode) == 2 );
    assert( Abc_ObjFanoutNum(pNode) == 0 );

    // when deleting an old node that is scheduled for replacement, remove it from the replacement queue
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceOld, pTemp, i )
        if ( pNode == pTemp )
        {
            // remove the entry from the replacement array
            for ( k = i; k < pMan->vStackReplaceOld->nSize - 1; k++ )
            {
                pMan->vStackReplaceOld->pArray[k] = pMan->vStackReplaceOld->pArray[k+1];
                pMan->vStackReplaceNew->pArray[k] = pMan->vStackReplaceNew->pArray[k+1];
            }
            pMan->vStackReplaceOld->nSize--;
            pMan->vStackReplaceNew->nSize--;
        }

    // when deleting a new node that should replace another node, do not delete
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceNew, pTemp, i )
        if ( pNode == Abc_ObjRegular(pTemp) )
            return;

    // remember the node's fanins
    pNode0 = Abc_ObjFanin0( pNode );
    pNode1 = Abc_ObjFanin1( pNode );

    // add the node to the list of updated nodes
    if ( pMan->vUpdatedNets )
    {
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode0 );
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode1 );
    }

    // remove the node from the table
    Abc_AigAndDelete( pMan, pNode );
    // if the node is in the level structure, remove it
    if ( pNode->fMarkA )
        Abc_AigRemoveFromLevelStructure( pMan->vLevels, pNode );
    if ( pNode->fMarkB )
        Abc_AigRemoveFromLevelStructureR( pMan->vLevelsR, pNode );
    // remove the node from the network
    Abc_NtkDeleteObj( pNode );

    // call recursively for the fanins
    if ( Abc_ObjIsNode(pNode0) && pNode0->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode0 );
    if ( Abc_ObjIsNode(pNode1) && pNode1->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode1 );
}